

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# previewImageExamples.cpp
# Opt level: O1

void writeRgbaWithPreview1(char *fileName,Array2D<Imf_3_2::Rgba> *pixels,int width,int height)

{
  PreviewRgba *pPVar1;
  int iVar2;
  int previewHeight;
  int previewWidth;
  RgbaOutputFile file;
  Array2D<Imf_3_2::PreviewRgba> previewPixels;
  Header header;
  uint local_98;
  uint local_94;
  Rgba local_90 [3];
  Array2D<Imf_3_2::PreviewRgba> local_78;
  PreviewImage local_60 [56];
  
  local_78._sizeX = 0;
  local_78._sizeY = 0;
  local_78._data = (PreviewRgba *)0x0;
  makePreviewImage(pixels,width,height,&local_78,(int *)&local_94,(int *)&local_98);
  local_90[0].r._h = 0;
  local_90[0].g._h = 0;
  local_90[0].b._h = 0;
  local_90[0].a._h = 0;
  Imf_3_2::Header::Header((Header *)0x3f800000,0x3f800000,local_60,width,height,local_90,0,3);
  pPVar1 = local_78._data;
  Imf_3_2::PreviewImage::PreviewImage((PreviewImage *)local_90,local_94,local_98,local_78._data);
  Imf_3_2::Header::setPreviewImage(local_60);
  Imf_3_2::PreviewImage::~PreviewImage((PreviewImage *)local_90);
  iVar2 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaOutputFile::RgbaOutputFile
            ((RgbaOutputFile *)local_90,fileName,(Header *)local_60,WRITE_RGBA,iVar2);
  Imf_3_2::RgbaOutputFile::setFrameBuffer(local_90,(ulong)pixels->_data,1);
  Imf_3_2::RgbaOutputFile::writePixels((int)local_90);
  Imf_3_2::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)local_90);
  Imf_3_2::Header::~Header((Header *)local_60);
  if (pPVar1 != (PreviewRgba *)0x0) {
    operator_delete__(pPVar1);
  }
  return;
}

Assistant:

void
writeRgbaWithPreview1 (
    const char fileName[], const Array2D<Rgba>& pixels, int width, int height)
{
    //
    // Write an image file with a preview image, version 1:
    //
    // - generate the preview image by subsampling the main image
    // - generate a file header
    // - add the preview image to the file header
    // - open the file (this stores the header with the
    //   preview image in the file)
    // - describe the memory layout of the main image's pixels
    // - store the main image's pixels in the file
    //

    Array2D<PreviewRgba> previewPixels;
    int                  previewWidth;
    int                  previewHeight;

    makePreviewImage (
        pixels, width, height, previewPixels, previewWidth, previewHeight);

    Header header (width, height);

    header.setPreviewImage (
        PreviewImage (previewWidth, previewHeight, &previewPixels[0][0]));

    RgbaOutputFile file (fileName, header, WRITE_RGBA);
    file.setFrameBuffer (&pixels[0][0], 1, width);
    file.writePixels (height);
}